

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O2

void __thiscall
re2c::DFA::emit_body
          (DFA *this,OutputFile *o,uint32_t *ind,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_labels,
          label_t initial)

{
  uint32_t ind_00;
  State *s;
  size_type sVar1;
  OutputFile *pOVar2;
  opt_t *poVar3;
  State **ppSVar4;
  bool readCh;
  DFA *local_70;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *local_68;
  string *local_60;
  ulong local_58;
  string local_50;
  
  local_70 = this;
  local_68 = used_labels;
  sVar1 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                    (used_labels,&this->head->label);
  if (sVar1 != 0) {
    pOVar2 = OutputFile::wind(o,*ind);
    pOVar2 = OutputFile::ws(pOVar2,"goto ");
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    pOVar2 = OutputFile::wstring(pOVar2,&poVar3->labelPrefix);
    pOVar2 = OutputFile::wlabel(pOVar2,initial);
    OutputFile::ws(pOVar2,";\n");
  }
  local_58 = (long)(local_70->accepts).elems.
                   super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_70->accepts).elems.
                   super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  local_60 = &local_70->cond;
  ppSVar4 = &local_70->head;
  while (s = *ppSVar4, s != (State *)0x0) {
    readCh = false;
    ind_00 = *ind;
    sVar1 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                      (local_68,&s->label);
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    if (poVar3->target != DOT) {
      if (sVar1 != 0) {
        poVar3 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        pOVar2 = OutputFile::wstring(o,&poVar3->labelPrefix);
        pOVar2 = OutputFile::wlabel(pOVar2,(label_t)(s->label).value);
        OutputFile::ws(pOVar2,":\n");
      }
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_00166888);
      if ((poVar3->dFlag == true) && ((s->action).type != INITIAL)) {
        pOVar2 = OutputFile::wind(o,ind_00);
        poVar3 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        pOVar2 = OutputFile::wstring(pOVar2,&poVar3->yydebug);
        pOVar2 = OutputFile::ws(pOVar2,"(");
        pOVar2 = OutputFile::wlabel(pOVar2,(label_t)(s->label).value);
        pOVar2 = OutputFile::ws(pOVar2,", ");
        poVar3 = realopt_t::operator->((realopt_t *)&DAT_00166888);
        InputAPI::expr_peek_abi_cxx11_(&local_50,&poVar3->input_api);
        pOVar2 = OutputFile::wstring(pOVar2,&local_50);
        OutputFile::ws(pOVar2,");\n");
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    emit_action(&s->action,o,*ind,&readCh,s,local_60,local_70->skeleton,local_68,8 < local_58);
    Go::emit(&s->go,o,*ind,&readCh);
    ppSVar4 = &s->next;
  }
  return;
}

Assistant:

void DFA::emit_body (OutputFile & o, uint32_t& ind, const std::set<label_t> & used_labels, label_t initial) const
{
	// If DFA has transitions to initial state, then initial state
	// has a piece of code that advances input position. Wee must
	// skip it when entering DFA.
	if (used_labels.count(head->label))
	{
		o.wind(ind).ws("goto ").wstring(opts->labelPrefix).wlabel(initial).ws(";\n");
	}

	const bool save_yyaccept = accepts.size () > 1;
	for (State * s = head; s; s = s->next)
	{
		bool readCh = false;
		emit_state (o, ind, s, used_labels.count (s->label) != 0);
		emit_action (s->action, o, ind, readCh, s, cond, skeleton, used_labels, save_yyaccept);
		s->go.emit(o, ind, readCh);
	}
}